

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcmain3.c
# Opt level: O2

LispPTR gcmapscan(void)

{
  uint *puVar1;
  LispPTR *pLVar2;
  LispPTR *pLVar3;
  int probe;
  uint *puVar4;
  uint uVar5;
  LispPTR LVar6;
  
  probe = 0x8000;
LAB_0011f1ee:
  do {
    probe = gcscan1(probe);
    pLVar3 = HTmain;
    if (probe == -1) {
      return 0;
    }
    LVar6 = HTmain[probe];
    while ((LVar6 & 1) != 0) {
      uVar5 = LVar6 & 0xfffffffe;
      puVar4 = (uint *)0x0;
      while( true ) {
        puVar1 = HTcoll + uVar5;
        uVar5 = *puVar1;
        if (uVar5 < 0x10000) break;
        uVar5 = puVar1[1];
        puVar4 = puVar1;
        if (uVar5 == 0) goto LAB_0011f1ee;
      }
      if (puVar4 == (uint *)0x0) {
        pLVar3[probe] = puVar1[1] | 1;
      }
      else {
        puVar4[1] = puVar1[1];
      }
      *puVar1 = 0;
      puVar1[1] = *HTcoll;
      *HTcoll = (LispPTR)((ulong)((long)puVar1 - (long)HTcoll) >> 2);
      if (HTcoll[(ulong)(pLVar3[probe] & 0xfffffffe) + 1] == 0) {
        pLVar2 = HTcoll + (pLVar3[probe] & 0xfffffffe);
        pLVar3[probe] = *pLVar2;
        *pLVar2 = 0;
        pLVar2[1] = *HTcoll;
        *HTcoll = (LispPTR)((ulong)((long)pLVar2 - (long)HTcoll) >> 2);
      }
      LVar6 = (uVar5 & 0xfffe) << 0xf | probe * 2;
      while (LVar6 = gcreccell(LVar6), LVar6 != 0) {
        if ((-1 < *(short *)((ulong)(LVar6 >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2)) &&
           (*GcDisabled_word != 0x4c)) {
          rec_htfind(LVar6,0);
        }
      }
      LVar6 = pLVar3[probe];
      if (LVar6 == 0) goto LAB_0011f1ee;
    }
    if (LVar6 < 0x10000) {
      LVar6 = LVar6 << 0xf | probe * 2;
      pLVar3[probe] = 0;
      while (LVar6 = gcreccell(LVar6), LVar6 != 0) {
        if ((-1 < *(short *)((ulong)(LVar6 >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2)) &&
           (*GcDisabled_word != 0x4c)) {
          rec_htfind(LVar6,0);
        }
      }
    }
  } while( true );
}

Assistant:

LispPTR gcmapscan(void) {
  int probe;
  GCENTRY *entry;
  GCENTRY offset, dbgcontents;
  LispPTR ptr;

  probe = HTMAIN_ENTRY_COUNT;
nextentry:
  while ((probe = gcscan1(probe)) != -1) {
    entry = (GCENTRY *)HTmain + probe;
  retry:
    if (HENTRY->collision) {
      GCENTRY *prev;
      GCENTRY *link;
      LispPTR content;

      prev = (GCENTRY *)0;
      link = (GCENTRY *)HTcoll + GetLinkptr((content = HTLPTR->contents));
    linkloop:
      offset = ((struct htcoll *)link)->free_ptr;
      if (StkCntIsZero(offset)) {
        /* Reclaimable object */
        ptr = VAG2(GetSegnuminColl(offset), (probe << 1));
        DelLink(link, prev, entry);
        GcreclaimLp(ptr);
        if (HTLPTR->contents == 0)
          goto nextentry;
        else
          goto retry;
      }
      if ((offset = ((struct htcoll *)link)->next_free)) {
        prev = link;
        link = (GCENTRY *)(HTcoll + offset);
        goto linkloop;
      }
      goto nextentry;
    }
    if (StkCntIsZero(dbgcontents = HTLPTR->contents)) {
      ptr = VAG2(HENTRY->segnum, (probe << 1));
      HTLPTR->contents = 0;
      GcreclaimLp(ptr);
    }
  }
  return (NIL);
}